

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall helics::CommsInterface::setFlag(CommsInterface *this,string_view flag,bool val)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_type __rlen;
  bool bVar4;
  string_view message_00;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((flag._M_len == 0xb) && (iVar3 = bcmp(flag._M_str,"server_mode",0xb), iVar3 == 0)) {
    cVar2 = '\0';
    do {
      LOCK();
      cVar1 = (this->operating)._M_base._M_i;
      bVar4 = cVar2 == cVar1;
      if (bVar4) {
        (this->operating)._M_base._M_i = true;
        cVar1 = cVar2;
      }
      cVar2 = cVar1;
      UNLOCK();
      if (bVar4) {
        this->serverMode = val;
        LOCK();
        if ((this->operating)._M_base._M_i == true) {
          (this->operating)._M_base._M_i = false;
        }
        UNLOCK();
        return;
      }
    } while ((this->txStatus)._M_i == STARTUP);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unrecognized flag :","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_50,flag._M_str,flag._M_len);
    message_00._M_str = local_50._M_dataplus._M_p;
    message_00._M_len = local_50._M_string_length;
    logWarning(this,message_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "server_mode") {
        setServerMode(val);
    } else {
        std::string message("unrecognized flag :");
        message.append(flag);
        logWarning(message);
    }
}